

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator02buggy.cpp
# Opt level: O2

double factorial(double d)

{
  int iVar1;
  int iVar2;
  double dVar3;
  allocator<char> local_39;
  double local_38;
  string local_28;
  
  if (((double)(int)d != d) || (NAN((double)(int)d) || NAN(d))) {
    local_38 = d;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"\'!\' could be used only on integers",&local_39);
    error(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    d = local_38;
  }
  iVar1 = (int)d;
  iVar2 = iVar1;
  if (iVar1 == 0) {
    dVar3 = 1.0;
  }
  else {
    while (2 < iVar2) {
      iVar1 = iVar1 * (iVar2 + -1);
      iVar2 = iVar2 + -1;
    }
    dVar3 = (double)iVar1;
  }
  return dVar3;
}

Assistant:

double factorial(double d)
{
	auto i = static_cast<int32_t>(d);
	if (i != d)
		error("'!' could be used only on integers");
	if (i == 0)
		return 1.0; // factorial of 0 is 1
	for (auto j = (i - 1); j > 1; --j)
		i *= j;
	return static_cast<double>(i);
}